

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrep.c
# Opt level: O0

int xrep0_pipe_init(void *arg,nni_pipe *pipe,void *s)

{
  int rv;
  xrep0_pipe *p;
  void *s_local;
  nni_pipe *pipe_local;
  void *arg_local;
  
  nni_aio_init((nni_aio *)((long)arg + 0x18),xrep0_pipe_getq_cb,arg);
  nni_aio_init((nni_aio *)((long)arg + 0x1e0),xrep0_pipe_send_cb,arg);
  nni_aio_init((nni_aio *)((long)arg + 0x3a8),xrep0_pipe_recv_cb,arg);
  nni_aio_init((nni_aio *)((long)arg + 0x570),xrep0_pipe_putq_cb,arg);
  *(nni_pipe **)arg = pipe;
  *(void **)((long)arg + 8) = s;
  arg_local._4_4_ = nni_msgq_init((nni_msgq **)((long)arg + 0x10),0x40);
  if (arg_local._4_4_ == 0) {
    arg_local._4_4_ = 0;
  }
  else {
    xrep0_pipe_fini(arg);
  }
  return arg_local._4_4_;
}

Assistant:

static int
xrep0_pipe_init(void *arg, nni_pipe *pipe, void *s)
{
	xrep0_pipe *p = arg;
	int         rv;

	nni_aio_init(&p->aio_getq, xrep0_pipe_getq_cb, p);
	nni_aio_init(&p->aio_send, xrep0_pipe_send_cb, p);
	nni_aio_init(&p->aio_recv, xrep0_pipe_recv_cb, p);
	nni_aio_init(&p->aio_putq, xrep0_pipe_putq_cb, p);

	p->pipe = pipe;
	p->rep  = s;

	// We want a pretty deep send queue on pipes. The rationale here is
	// that the send rate will be mitigated by the receive rate.
	// If a slow pipe (req pipe not reading its own responses!?)
	// comes up, then we will start discarding its replies eventually,
	// but it takes some time.  It would be poor form for a peer to
	// smash us with requests, but be unable to handle replies faster
	// than we can forward them.  If they do that, their replies get
	// dropped.  (From a DDoS perspective, it might be nice in the
	// future if we had a way to exert back pressure to the send side --
	// essentially don't let peers send requests faster than they are
	// willing to receive replies.  Something to think about for the
	// future.)
	if ((rv = nni_msgq_init(&p->sendq, 64)) != 0) {
		xrep0_pipe_fini(p);
		return (rv);
	}
	return (0);
}